

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RichHdrWrapper.cpp
# Opt level: O3

bufsize_t __thiscall RichHdrWrapper::getSize(RichHdrWrapper *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bufsize_t bVar3;
  
  if (this->richSign != (RICH_SIGNATURE *)0x0) {
    if (this->dansHdr == (RICH_DANS_HEADER *)0x0) {
      bVar3 = 0;
    }
    else {
      iVar1 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,this->dansHdr,0);
      iVar2 = (*(this->super_PEElementWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[6])(this,this->richSign,0);
      bVar3 = (CONCAT44(extraout_var_00,iVar2) - CONCAT44(extraout_var,iVar1)) + 8;
    }
    return bVar3;
  }
  return 0;
}

Assistant:

bufsize_t RichHdrWrapper::getSize()
{
    if (!this->richSign || !this->dansHdr) {
        return 0;
    }
    const offset_t dansOffset = getOffset(this->dansHdr);
    const offset_t richOffset = getOffset(this->richSign);
    offset_t diff = richOffset - dansOffset;

    pe::RICH_SIGNATURE rich1 = { 0 };
    diff += sizeof(rich1);
    return diff;
}